

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall GraphBuilder::printNodes(GraphBuilder *this,ostream *ostream)

{
  _Hash_node_base *p_Var1;
  string local_48;
  
  p_Var1 = (this->llvmToNodeMap_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      Node::dump_abi_cxx11_(&local_48,(Node *)p_Var1[2]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                (ostream,local_48._M_dataplus._M_p,local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  p_Var1 = (this->artificialNodes_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      Node::dump_abi_cxx11_(&local_48,(Node *)p_Var1[1]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                (ostream,local_48._M_dataplus._M_p,local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void GraphBuilder::printNodes(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        ostream << iterator.second->dump();
    }
    for (const auto &iterator : artificialNodes_) {
        ostream << iterator->dump();
    }
}